

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fib.c
# Opt level: O3

void ndn_fib_init(void *memory,ndn_table_id_t capacity,ndn_nametree_t *nametree)

{
  undefined8 *puVar1;
  long lVar2;
  undefined2 in_register_00000032;
  
  *(ndn_table_id_t *)((long)memory + 8) = capacity;
  *(ndn_nametree_t **)memory = nametree;
  if (CONCAT22(in_register_00000032,capacity) != 0) {
    lVar2 = 0;
    do {
      *(undefined2 *)((long)memory + lVar2 + 0x28) = 0xffff;
      puVar1 = (undefined8 *)((long)memory + lVar2 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)memory + lVar2 + 0x20) = 0;
      lVar2 = lVar2 + 0x20;
    } while ((ulong)capacity * 0x20 != lVar2);
  }
  return;
}

Assistant:

void
ndn_fib_init(void* memory, ndn_table_id_t capacity, ndn_nametree_t* nametree)
{
  ndn_table_id_t i;
  ndn_fib_t* self = (ndn_fib_t*)memory;
  self->capacity = capacity;
  self->nametree = nametree;
  for(i = 0; i < capacity; i ++){
    ndn_fib_entry_reset(&self->slots[i]);
  }
}